

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.h
# Opt level: O2

void __thiscall FuncInfo::EndRecordingOutArgs(FuncInfo *this,ArgSlot argCount)

{
  uint32 *puVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  RegSlot RVar6;
  
  if (this->outArgsDepth == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
                       ,0x26e,"(outArgsDepth > 0)","mismatched Start and End");
    if (!bVar3) goto LAB_007744ed;
    *puVar5 = 0;
  }
  uVar4 = this->outArgsCurrentExpr;
  if (uVar4 < argCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
                       ,0x26f,"(outArgsCurrentExpr >= argCount)","outArgsCurrentExpr >= argCount");
    if (!bVar3) goto LAB_007744ed;
    *puVar5 = 0;
    uVar4 = this->outArgsCurrentExpr;
  }
  RVar6 = ~(uint)argCount + uVar4;
  puVar1 = &this->outArgsDepth;
  *puVar1 = *puVar1 - 1;
  this->outArgsCurrentExpr = RVar6;
  if ((*puVar1 == 0) && (RVar6 != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
                       ,0x276,"(outArgsDepth != 0 || outArgsCurrentExpr == 0)",
                       "outArgsDepth != 0 || outArgsCurrentExpr == 0");
    if (!bVar3) {
LAB_007744ed:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

void EndRecordingOutArgs(Js::ArgSlot argCount)
    {
        AssertMsg(outArgsDepth > 0, "mismatched Start and End");
        Assert(outArgsCurrentExpr >= argCount);
#if DBG
        outArgsDepth--;
#endif
        // Add one to pop the space to save the m_outParams pointer
        outArgsCurrentExpr -= (argCount + 1);

        Assert(outArgsDepth != 0 || outArgsCurrentExpr == 0);
    }